

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O2

void model_rd_for_sb(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
                    int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
                    int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int64_t var;
  byte bVar3;
  long lVar4;
  int64_t iVar5;
  long lVar6;
  undefined7 in_register_00000031;
  macroblock_plane *p;
  macroblockd_plane *pd;
  int rate;
  MACROBLOCK *local_80;
  MACROBLOCKD *local_78;
  long local_70;
  BLOCK_SIZE (*local_68) [2] [2];
  AV1_COMP *local_60;
  long local_58;
  long local_50;
  long local_48;
  int64_t square_error;
  long local_38;
  
  local_70 = (long)(*xd->mi)->ref_frame[0];
  lVar6 = (long)plane_from;
  local_58 = (long)plane_to;
  p = x->plane + lVar6;
  pd = xd->plane + lVar6;
  local_68 = av1_ss_size_lookup + (CONCAT71(in_register_00000031,bsize) & 0xffffffff);
  square_error = 0;
  local_48 = 0;
  local_50 = 0;
  local_80 = x;
  local_78 = xd;
  local_60 = cpi;
  while ((lVar6 <= local_58 && ((lVar6 == 0 || (local_78->is_chroma_ref == true))))) {
    BVar1 = (*local_68)[pd->subsampling_x][pd->subsampling_y];
    var = calculate_sse(local_78,p,pd,(uint)block_size_wide[BVar1],(uint)block_size_high[BVar1]);
    bVar3 = 3;
    if ((((local_80->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar3 = (char)(local_80->e_mbd).bd - 5;
    }
    if ((local_60->sf).rd_sf.simple_model_rd_from_var == 0) {
      av1_model_rd_from_var_lapndz
                (var,(uint)"\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[BVar1],
                 (int)p->dequant_QTX[1] >> (bVar3 & 0x1f),&rate,&local_38);
      lVar4 = local_38;
    }
    else {
      iVar2 = (int)p->dequant_QTX[1] >> (bVar3 & 0x1f);
      lVar4 = 0;
      if ((iVar2 < 0x78) && (lVar4 = (long)((ulong)(0x118 - iVar2) * var) >> 7, 0x7ffffffe < lVar4))
      {
        lVar4 = 0x7fffffff;
      }
      rate = (int)lVar4;
      lVar4 = iVar2 * var >> 8;
    }
    if (lVar6 == 0) {
      iVar5 = 0xffffffff;
      if (var < 0xffffffff) {
        iVar5 = var;
      }
      local_80->pred_sse[local_70] = (uint)iVar5;
    }
    if (plane_rate != (int *)0x0) {
      plane_rate[lVar6] = rate;
    }
    if (plane_sse != (int64_t *)0x0) {
      plane_sse[lVar6] = var;
    }
    if (plane_dist != (int64_t *)0x0) {
      plane_dist[lVar6] = lVar4 * 0x10;
    }
    square_error = square_error + var;
    local_50 = local_50 + rate;
    local_48 = local_48 + lVar4 * 0x10;
    lVar6 = lVar6 + 1;
    p = p + 1;
    pd = pd + 1;
  }
  if (skip_txfm_sb != (uint8_t *)0x0) {
    *skip_txfm_sb = square_error == 0;
  }
  if (skip_sse_sb != (int64_t *)0x0) {
    *skip_sse_sb = square_error << 4;
  }
  lVar6 = 0x7fffffff;
  if (local_50 < 0x7fffffff) {
    lVar6 = local_50;
  }
  *out_rate_sum = (int)lVar6;
  *out_dist_sum = local_48;
  return;
}

Assistant:

static inline void model_rd_for_sb(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                   MACROBLOCK *x, MACROBLOCKD *xd,
                                   int plane_from, int plane_to,
                                   int *out_rate_sum, int64_t *out_dist_sum,
                                   uint8_t *skip_txfm_sb, int64_t *skip_sse_sb,
                                   int *plane_rate, int64_t *plane_sse,
                                   int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  int plane;
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  assert(bsize < BLOCK_SIZES_ALL);

  for (plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    int64_t sse;
    int rate;
    int64_t dist;

    sse = calculate_sse(xd, p, pd, bw, bh);

    model_rd_from_sse(cpi, x, plane_bsize, plane, sse, bw * bh, &rate, &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;
    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
    assert(rate_sum >= 0);
  }

  if (skip_txfm_sb) *skip_txfm_sb = total_sse == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  rate_sum = AOMMIN(rate_sum, INT_MAX);
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}